

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O1

void __thiscall amrex::EB2::Level::fillCentroid(Level *this,MultiFab *centroid,Geometry *geom)

{
  int iVar1;
  Periodicity local_50;
  IntVect local_40;
  IntVect local_34;
  
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&centroid->super_FabArray<amrex::FArrayBox>,0.0,0,
             (centroid->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,
             &(centroid->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow);
  if (this->m_allregular == false) {
    iVar1 = (centroid->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0];
    local_50 = Geometry::periodicity(geom);
    local_34.vect[0] = 0;
    local_34.vect[1] = 0;
    local_34.vect[2] = 0;
    local_40.vect[0] = iVar1;
    local_40.vect[1] = iVar1;
    local_40.vect[2] = iVar1;
    FabArray<amrex::FArrayBox>::ParallelCopy_nowait
              (&centroid->super_FabArray<amrex::FArrayBox>,
               &(this->m_centroid).super_FabArray<amrex::FArrayBox>,0,0,3,&local_34,&local_40,
               &local_50,COPY,(CPC *)0x0,false);
  }
  return;
}

Assistant:

void
Level::fillCentroid (MultiFab& centroid, const Geometry& geom) const
{
    centroid.setVal(0.0);
    if (!isAllRegular()) {
        centroid.ParallelCopy(m_centroid,0,0,AMREX_SPACEDIM,0,centroid.nGrow(),
                              geom.periodicity());
    }
}